

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::~BufferCopyToImage(BufferCopyToImage *this)

{
  ~BufferCopyToImage(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~BufferCopyToImage	(void) {}